

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_151d8d0::
SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
::RefTest(SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
          *this)

{
  uchar *puVar1;
  uchar *puVar2;
  bool bVar3;
  uint8_t uVar4;
  uint16_t uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint32_t uVar9;
  int iVar10;
  SubpelVarianceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_int,_int,_const_unsigned_char_*,_int,_unsigned_int_*,_const_unsigned_char_*)>
  *in_RDI;
  uint uVar11;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  uint32_t var2;
  uint32_t var1;
  uint32_t sse2;
  uint32_t sse1;
  int j_3;
  int j_2;
  int j_1;
  int j;
  int y;
  int x;
  uint *puVar12;
  undefined4 uVar13;
  char (*val) [13];
  AssertHelper *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe6c;
  aom_bit_depth_t aVar14;
  undefined4 in_stack_fffffffffffffe74;
  char *in_stack_fffffffffffffe78;
  Message *in_stack_fffffffffffffe80;
  Message *in_stack_fffffffffffffe88;
  AssertHelper *in_stack_fffffffffffffe90;
  uint8_t *puVar15;
  Message *message;
  AssertHelper *this_00;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_ffffffffffffff00;
  int iVar16;
  int iVar17;
  aom_bit_depth_t bit_depth;
  _func_uint_uchar_ptr_int_int_int_uchar_ptr_int_uint_ptr_uchar_ptr *p_Var18;
  AssertionResult local_98 [2];
  AssertionResult local_78 [2];
  RegisterStateCheckMMX local_56;
  uint32_t local_38;
  uint local_34;
  AssertHelper local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
      bVar3 = use_high_bit_depth(in_RDI);
      if (bVar3) {
        for (local_24 = 0; iVar10 = local_24, iVar6 = block_size(in_RDI), iVar10 < iVar6;
            local_24 = local_24 + 1) {
          uVar5 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_fffffffffffffe60);
          uVar9 = mask(in_RDI);
          *(uint16_t *)((long)in_RDI->src_ * 2 + (long)local_24 * 2) = uVar5 & (ushort)uVar9;
          uVar5 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_fffffffffffffe60);
          uVar9 = mask(in_RDI);
          *(uint16_t *)((long)in_RDI->sec_ * 2 + (long)local_24 * 2) = uVar5 & (ushort)uVar9;
        }
        local_28 = 0;
        while( true ) {
          iVar10 = local_28;
          iVar6 = block_size(in_RDI);
          iVar7 = width(in_RDI);
          iVar8 = height(in_RDI);
          if (iVar6 + iVar7 + iVar8 + 1 <= iVar10) break;
          uVar5 = libaom_test::ACMRandom::Rand16((ACMRandom *)in_stack_fffffffffffffe60);
          uVar9 = mask(in_RDI);
          *(uint16_t *)((long)in_RDI->ref_ * 2 + (long)local_28 * 2) = uVar5 & (ushort)uVar9;
          local_28 = local_28 + 1;
        }
      }
      else {
        for (local_1c = 0; iVar10 = local_1c, iVar6 = block_size(in_RDI), iVar10 < iVar6;
            local_1c = local_1c + 1) {
          uVar4 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_fffffffffffffe60);
          in_RDI->src_[local_1c] = uVar4;
          uVar4 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_fffffffffffffe60);
          in_RDI->sec_[local_1c] = uVar4;
        }
        local_20 = 0;
        while( true ) {
          iVar10 = local_20;
          iVar6 = block_size(in_RDI);
          iVar7 = width(in_RDI);
          iVar8 = height(in_RDI);
          if (iVar6 + iVar7 + iVar8 + 1 <= iVar10) break;
          uVar4 = libaom_test::ACMRandom::Rand8((ACMRandom *)in_stack_fffffffffffffe60);
          in_RDI->ref_[local_20] = uVar4;
          local_20 = local_20 + 1;
        }
      }
      libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_56);
      puVar1 = in_RDI->ref_;
      p_Var18 = (in_RDI->params_).func;
      iVar10 = width(in_RDI);
      puVar2 = in_RDI->src_;
      iVar16 = local_14;
      iVar17 = local_18;
      iVar6 = width(in_RDI);
      puVar12 = (uint *)((long)&local_30.data_ + 4);
      local_34 = (*p_Var18)(puVar1,iVar10 + 1,iVar16,iVar17,puVar2,iVar6,puVar12,in_RDI->sec_);
      bit_depth = (aom_bit_depth_t)p_Var18;
      uVar13 = (undefined4)((ulong)puVar12 >> 0x20);
      libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xcc859b);
      iVar7 = local_18;
      puVar15 = in_RDI->ref_;
      message = (Message *)in_RDI->src_;
      this_00 = (AssertHelper *)in_RDI->sec_;
      iVar10 = (in_RDI->params_).log2width;
      iVar6 = (in_RDI->params_).log2height;
      iVar8 = local_14;
      bVar3 = use_high_bit_depth(in_RDI);
      aVar14 = (in_RDI->params_).bit_depth;
      in_stack_fffffffffffffe60 = &local_30;
      val = (char (*) [13])CONCAT44(uVar13,iVar7);
      uVar11 = (uint)bVar3;
      local_38 = subpel_avg_variance_ref
                           ((uint8_t *)CONCAT44(iVar8,iVar6),
                            (uint8_t *)CONCAT44(iVar10,in_stack_fffffffffffffee8),(uint8_t *)this_00
                            ,(int)((ulong)message >> 0x20),(int)message,
                            (int)((ulong)puVar15 >> 0x20),in_stack_ffffffffffffff00,
                            (uint32_t *)CONCAT44(iVar17,iVar16),SUB81((ulong)puVar15 >> 0x18,0),
                            bit_depth);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe78,(char *)CONCAT44(in_stack_fffffffffffffe74,aVar14),
                 (uint *)CONCAT44(in_stack_fffffffffffffe6c,uVar11),
                 (uint *)in_stack_fffffffffffffe60);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(local_78);
      if (!bVar3) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,val);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(int *)val);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(char (*) [3])val);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(int *)val);
        testing::AssertionResult::failure_message((AssertionResult *)0xcc874c);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20)
                   ,(char *)CONCAT44(in_stack_fffffffffffffe74,aVar14));
        testing::internal::AssertHelper::operator=(this_00,message);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0xcc87a6);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc8814);
      testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                (in_stack_fffffffffffffe78,(char *)CONCAT44(in_stack_fffffffffffffe74,aVar14),
                 (uint *)CONCAT44(in_stack_fffffffffffffe6c,uVar11),
                 (uint *)in_stack_fffffffffffffe60);
      bVar3 = testing::AssertionResult::operator_cast_to_bool(local_98);
      if (!bVar3) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe90);
        testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,val);
        in_stack_fffffffffffffe90 =
             (AssertHelper *)
             testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(int *)val);
        in_stack_fffffffffffffe88 =
             testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(char (*) [3])val);
        in_stack_fffffffffffffe80 =
             testing::Message::operator<<((Message *)in_stack_fffffffffffffe60,(int *)val);
        in_stack_fffffffffffffe78 =
             testing::AssertionResult::failure_message((AssertionResult *)0xcc88ea);
        testing::internal::AssertHelper::AssertHelper
                  (in_stack_fffffffffffffe90,(Type)((ulong)in_stack_fffffffffffffe88 >> 0x20),
                   (char *)in_stack_fffffffffffffe80,(int)((ulong)in_stack_fffffffffffffe78 >> 0x20)
                   ,(char *)CONCAT44(in_stack_fffffffffffffe74,aVar14));
        testing::internal::AssertHelper::operator=(this_00,message);
        testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffe60);
        testing::Message::~Message((Message *)0xcc8944);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0xcc89af);
    }
  }
  return;
}

Assistant:

void SubpelVarianceTest<SubpixAvgVarMxNFunc>::RefTest() {
  for (int x = 0; x < 8; ++x) {
    for (int y = 0; y < 8; ++y) {
      if (!use_high_bit_depth()) {
        for (int j = 0; j < block_size(); j++) {
          src_[j] = rnd_.Rand8();
          sec_[j] = rnd_.Rand8();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          ref_[j] = rnd_.Rand8();
        }
      } else {
        for (int j = 0; j < block_size(); j++) {
          CONVERT_TO_SHORTPTR(src_)[j] = rnd_.Rand16() & mask();
          CONVERT_TO_SHORTPTR(sec_)[j] = rnd_.Rand16() & mask();
        }
        for (int j = 0; j < block_size() + width() + height() + 1; j++) {
          CONVERT_TO_SHORTPTR(ref_)[j] = rnd_.Rand16() & mask();
        }
      }
      uint32_t sse1, sse2;
      uint32_t var1, var2;
      API_REGISTER_STATE_CHECK(var1 = params_.func(ref_, width() + 1, x, y,
                                                   src_, width(), &sse1, sec_));
      var2 = subpel_avg_variance_ref(ref_, src_, sec_, params_.log2width,
                                     params_.log2height, x, y, &sse2,
                                     use_high_bit_depth(), params_.bit_depth);
      EXPECT_EQ(sse1, sse2) << "at position " << x << ", " << y;
      EXPECT_EQ(var1, var2) << "at position " << x << ", " << y;
    }
  }
}